

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  NameAndLocation *in_RSI;
  
  iVar2 = (*(this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
            super_NonCopyable._vptr_NonCopyable[5])();
  if ((char)iVar2 != '\0') {
    return;
  }
  __lhs = (this->m_filters).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = extraout_EDX;
  if ((__lhs != (this->m_filters).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) && (__lhs->_M_string_length != 0)) {
    in_RSI = &(this->super_TrackerBase).m_nameAndLocation;
    _Var1 = std::operator==(__lhs,&in_RSI->name);
    iVar2 = extraout_EDX_00;
    if (!_Var1) {
      return;
    }
  }
  TrackerBase::open(&this->super_TrackerBase,(char *)in_RSI,iVar2);
  return;
}

Assistant:

void tryOpen() {
            if( !isComplete() && (m_filters.empty() || m_filters[0].empty() ||  m_filters[0] == m_nameAndLocation.name ) )
                open();
        }